

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

int testing::internal::
    CountIf<std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>,bool(*)(testing::TestCase_const*)>
              (vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *c,
              _func_bool_TestCase_ptr *predicate)

{
  bool bVar1;
  int iVar2;
  pointer ppTVar3;
  
  iVar2 = 0;
  for (ppTVar3 = (c->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (c->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    bVar1 = (*predicate)(*ppTVar3);
    iVar2 = iVar2 + (uint)bVar1;
  }
  return iVar2;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (typename Container::const_iterator it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}